

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nap_comm_struct.hpp
# Opt level: O0

void form_local_comm(int orig_num_sends,int *orig_send_procs,int *orig_send_ptr,
                    int *orig_send_indices,vector<int,_std::allocator<int>_> *nodes_to_local,
                    comm_data *send_data,comm_data *recv_data,comm_data *local_data,
                    vector<int,_std::allocator<int>_> *recv_idx_nodes,MPI_Comm mpi_comm,
                    topo_data *topo_info,int tag)

{
  value_type vVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  const_reference pvVar7;
  reference pvVar8;
  ulong uVar9;
  void *pvVar10;
  int *piVar11;
  reference ppoVar12;
  allocator_type *paVar13;
  ompi_request_t **ppoVar14;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  size_type sVar15;
  int in_EDI;
  vector<int,_std::allocator<int>_> *in_R8;
  int *in_R9;
  int *in_stack_00000008;
  int *in_stack_00000010;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  undefined8 in_stack_00000020;
  long in_stack_00000028;
  undefined4 in_stack_00000030;
  int i_4;
  int j_2;
  int i_3;
  int j_1;
  int j;
  int i_2;
  vector<int,_std::allocator<int>_> send_idx_node;
  int i_1;
  int i;
  vector<int,_std::allocator<int>_> local_idx;
  vector<int,_std::allocator<int>_> orig_to_node;
  vector<int,_std::allocator<int>_> recv_buffer;
  vector<int,_std::allocator<int>_> send_sizes;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> send_requests;
  vector<int,_std::allocator<int>_> send_buffer;
  MPI_Status recv_status;
  int proc;
  int proc_idx;
  int idx;
  int node;
  int end;
  int start;
  int start_ctr;
  int ctr;
  int size;
  int local_proc;
  int global_proc;
  MPI_Comm *local_comm;
  int local_num_procs;
  int local_rank;
  int num_procs;
  int rank;
  topo_data *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  allocator_type *in_stack_fffffffffffffe10;
  reference in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 uVar16;
  undefined4 in_stack_fffffffffffffe2c;
  undefined4 uVar17;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffe30;
  undefined8 uVar18;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  vector<int,_std::allocator<int>_> local_150;
  int local_138;
  int local_134;
  undefined4 local_130;
  vector<int,_std::allocator<int>_> local_120;
  vector<int,_std::allocator<int>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  vector<int,_std::allocator<int>_> local_d8;
  vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> local_c0;
  vector<int,_std::allocator<int>_> local_a8;
  undefined4 local_90 [7];
  undefined4 local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  undefined4 local_4c;
  undefined8 *local_48;
  undefined4 local_40;
  int local_3c;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  int *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  long local_20;
  long local_18;
  long local_10;
  int local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_4 = in_EDI;
  MPI_Comm_rank(in_stack_00000020,local_34);
  MPI_Comm_size(in_stack_00000020,local_38);
  local_48 = (undefined8 *)(in_stack_00000028 + 0x10);
  MPI_Comm_rank(*local_48,&local_3c);
  MPI_Comm_size(*local_48,&local_40);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x157b70);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::vector
            ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x157b7d);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x157b8a);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x157b97);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x157bac);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x157bb9);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (size_type)in_stack_fffffffffffffe18);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (size_type)in_stack_fffffffffffffe18);
  local_130 = 0;
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_fffffffffffffe30,CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
             ,(value_type *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
  comm_data::init_num_data
            ((comm_data *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  comm_data::init_num_data
            ((comm_data *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  comm_data::init_num_data
            ((comm_data *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
             (int)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
  for (local_134 = 0; local_134 < local_4; local_134 = local_134 + 1) {
    local_4c = *(undefined4 *)(local_10 + (long)local_134 * 4);
    local_54 = *(int *)(local_18 + (long)(local_134 + 1) * 4) -
               *(int *)(local_18 + (long)local_134 * 4);
    local_68 = get_node(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8);
    if (*(int *)(in_stack_00000028 + 0xc) == local_68) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)local_134);
      *pvVar8 = -1;
      iVar6 = get_local_proc(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8);
      *(int *)(*(long *)(in_stack_00000010 + 2) + (long)*in_stack_00000010 * 4) = iVar6;
      in_stack_00000010[1] = local_54 + in_stack_00000010[1];
      *in_stack_00000010 = *in_stack_00000010 + 1;
      *(int *)(*(long *)(in_stack_00000010 + 4) + (long)*in_stack_00000010 * 4) =
           in_stack_00000010[1];
    }
    else {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_68);
      local_50 = *pvVar7;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(long)local_50);
      if (*pvVar8 == 0) {
        iVar6 = *local_30;
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_120,(long)local_50);
        *pvVar8 = iVar6;
        iVar6 = *local_30;
        *local_30 = iVar6 + 1;
        *(int *)(*(long *)(local_30 + 2) + (long)iVar6 * 4) = local_50;
      }
      iVar6 = local_68;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)local_134);
      iVar5 = local_54;
      *pvVar8 = iVar6;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(long)local_50);
      *pvVar8 = iVar5 + *pvVar8;
    }
  }
  if (in_stack_00000010[1] != 0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)in_stack_00000010[1];
    uVar9 = SUB168(auVar2 * ZEXT816(4),0);
    if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar9);
    *(void **)(in_stack_00000010 + 6) = pvVar10;
  }
  for (local_138 = 0; local_138 < *local_30; local_138 = local_138 + 1) {
    local_50 = *(int *)(*(long *)(local_30 + 2) + (long)local_138 * 4);
    iVar6 = *(int *)(*(long *)(local_30 + 4) + (long)local_138 * 4);
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(long)local_50);
    *(int *)(*(long *)(local_30 + 4) + (long)(local_138 + 1) * 4) = iVar6 + *pvVar8;
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(long)local_50);
    *pvVar8 = 0;
  }
  local_30[1] = *(int *)(*(long *)(local_30 + 4) + (long)*local_30 * 4);
  if (local_30[1] != 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)local_30[1];
    uVar9 = SUB168(auVar3 * ZEXT816(4),0);
    if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar9);
    *(void **)(local_30 + 6) = pvVar10;
  }
  std::allocator<int>::allocator((allocator<int> *)0x15805b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (size_type)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  std::allocator<int>::~allocator((allocator<int> *)0x158081);
  in_stack_00000010[1] = 0;
  for (local_158 = 0; local_158 < local_4; local_158 = local_158 + 1) {
    pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_108,(long)local_158);
    local_68 = *pvVar8;
    local_60 = *(int *)(local_18 + (long)local_158 * 4);
    local_64 = *(int *)(local_18 + (long)(local_158 + 1) * 4);
    local_15c = local_60;
    if (local_68 == -1) {
      for (; local_15c < local_64; local_15c = local_15c + 1) {
        uVar16 = *(undefined4 *)(local_20 + (long)local_15c * 4);
        iVar6 = in_stack_00000010[1];
        in_stack_00000010[1] = iVar6 + 1;
        *(undefined4 *)(*(long *)(in_stack_00000010 + 6) + (long)iVar6 * 4) = uVar16;
      }
    }
    else {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](local_28,(long)local_68);
      local_50 = *pvVar7;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_120,(long)local_50);
      local_70 = *pvVar8;
      for (local_160 = local_60; local_160 < local_64; local_160 = local_160 + 1) {
        iVar6 = *(int *)(*(long *)(local_30 + 4) + (long)local_70 * 4);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(long)local_50);
        iVar5 = local_68;
        local_6c = *pvVar8;
        *pvVar8 = local_6c + 1;
        local_6c = iVar6 + local_6c;
        *(undefined4 *)(*(long *)(local_30 + 6) + (long)local_6c * 4) =
             *(undefined4 *)(local_20 + (long)local_160 * 4);
        pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)local_6c);
        *pvVar8 = iVar5;
      }
    }
  }
  piVar11 = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x1582dc);
  MPI_Allreduce(1,piVar11,local_40,&ompi_mpi_int,&ompi_mpi_op_sum,*local_48);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_d8,(long)local_3c);
  in_stack_00000008[1] = *pvVar8;
  if (in_stack_00000008[1] != 0) {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = (long)in_stack_00000008[1];
    uVar9 = SUB168(auVar4 * ZEXT816(4),0);
    if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
      uVar9 = 0xffffffffffffffff;
    }
    pvVar10 = operator_new__(uVar9);
    *(void **)(in_stack_00000008 + 6) = pvVar10;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (size_type)in_stack_fffffffffffffe18);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (size_type)in_stack_fffffffffffffe18);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::resize
            ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (size_type)in_stack_fffffffffffffe18);
  local_58 = 0;
  for (local_164 = 0; local_5c = local_58, local_164 < *local_30; local_164 = local_164 + 1) {
    local_74 = *(undefined4 *)(*(long *)(local_30 + 2) + (long)local_164 * 4);
    local_64 = *(int *)(*(long *)(local_30 + 4) + (long)(local_164 + 1) * 4);
    local_168 = *(int *)(*(long *)(local_30 + 4) + (long)local_164 * 4);
    local_60 = local_168;
    for (; local_168 < local_64; local_168 = local_168 + 1) {
      vVar1 = *(value_type *)(*(long *)(local_30 + 6) + (long)local_168 * 4);
      sVar15 = (size_type)local_58;
      local_58 = local_58 + 1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_a8,sVar15);
      *pvVar8 = vVar1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_150,(long)local_168);
      vVar1 = *pvVar8;
      sVar15 = (size_type)local_58;
      local_58 = local_58 + 1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_a8,sVar15);
      *pvVar8 = vVar1;
    }
    in_stack_fffffffffffffe18 =
         std::vector<int,_std::allocator<int>_>::operator[](&local_a8,(long)local_5c);
    in_stack_fffffffffffffe24 = local_58 - local_5c;
    uVar18 = *local_48;
    uVar16 = local_74;
    uVar17 = in_stack_00000030;
    ppoVar12 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::operator[]
                         (&local_c0,(long)local_164);
    MPI_Isend(in_stack_fffffffffffffe18,in_stack_fffffffffffffe24,&ompi_mpi_int,uVar16,uVar17,uVar18
              ,ppoVar12);
  }
  local_58 = 0;
  while (local_58 < in_stack_00000008[1]) {
    MPI_Probe(0xffffffff,in_stack_00000030,*local_48,local_90);
    local_74 = local_90[0];
    MPI_Get_count(local_90,&ompi_mpi_int,&local_54);
    in_stack_fffffffffffffe10 = (allocator_type *)(long)local_54;
    paVar13 = (allocator_type *)std::vector<int,_std::allocator<int>_>::size(&local_f0);
    if (paVar13 < in_stack_fffffffffffffe10) {
      std::vector<int,_std::allocator<int>_>::resize
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (size_type)in_stack_fffffffffffffe18);
    }
    piVar11 = std::vector<int,_std::allocator<int>_>::data
                        ((vector<int,_std::allocator<int>_> *)0x1586ca);
    MPI_Recv(piVar11,local_54,&ompi_mpi_int,local_74,in_stack_00000030,*local_48,local_90);
    for (local_16c = 0; local_16c < local_54; local_16c = local_16c + 2) {
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_f0,(long)local_16c);
      *(value_type *)(*(long *)(in_stack_00000008 + 6) + (long)local_58 * 4) = *pvVar8;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](&local_f0,(long)(local_16c + 1));
      vVar1 = *pvVar8;
      sVar15 = (size_type)local_58;
      local_58 = local_58 + 1;
      pvVar8 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000018,sVar15);
      *pvVar8 = vVar1;
    }
    *(undefined4 *)(*(long *)(in_stack_00000008 + 2) + (long)*in_stack_00000008 * 4) = local_74;
    *(int *)(*(long *)(in_stack_00000008 + 4) + (long)(*in_stack_00000008 + 1) * 4) =
         *(int *)(*(long *)(in_stack_00000008 + 4) + (long)*in_stack_00000008 * 4) + local_54 / 2;
    *in_stack_00000008 = *in_stack_00000008 + 1;
  }
  if (*local_30 != 0) {
    iVar6 = *local_30;
    ppoVar14 = std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::data
                         ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)0x158865);
    MPI_Waitall(iVar6,ppoVar14,0);
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10);
  std::vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>::~vector
            ((vector<ompi_request_t_*,_std::allocator<ompi_request_t_*>_> *)
             in_stack_fffffffffffffe10);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10);
  return;
}

Assistant:

static void form_local_comm(const int orig_num_sends, const int* orig_send_procs,
        const int* orig_send_ptr, const int* orig_send_indices,
        const std::vector<int>& nodes_to_local, comm_data* send_data,
        comm_data* recv_data, comm_data* local_data,
        std::vector<int>& recv_idx_nodes, MPI_Comm mpi_comm,
        topo_data* topo_info, const int tag)
{
    // MPI_Information
    int rank, num_procs;
    int local_rank, local_num_procs;
    MPI_Comm_rank(mpi_comm, &rank);
    MPI_Comm_size(mpi_comm, &num_procs);
    MPI_Comm& local_comm = topo_info->local_comm;
    MPI_Comm_rank(local_comm, &local_rank);
    MPI_Comm_size(local_comm, &local_num_procs);

    // Declare variables
    int global_proc, local_proc;
    int size, ctr, start_ctr;
    int start, end, node;
    int idx, proc_idx;
    int proc;
    MPI_Status recv_status;

    std::vector<int> send_buffer;
    std::vector<MPI_Request> send_requests;
    std::vector<int> send_sizes;
    std::vector<int> recv_buffer;

    std::vector<int> orig_to_node;
    std::vector<int> local_idx;

    // Initialize variables
    orig_to_node.resize(orig_num_sends);
    local_idx.resize(local_num_procs);
    send_sizes.resize(local_num_procs, 0);

    send_data->init_num_data(local_num_procs);
    recv_data->init_num_data(local_num_procs);
    local_data->init_num_data(local_num_procs);

    // Form local_S_comm
    for (int i = 0; i < orig_num_sends; i++)
    {
        global_proc = orig_send_procs[i];
        size = orig_send_ptr[i+1] - orig_send_ptr[i];
        node = get_node(global_proc, topo_info);
        if (topo_info->rank_node != node)
        {
            local_proc = nodes_to_local[node];
            if (send_sizes[local_proc] == 0)
            {
                local_idx[local_proc] = send_data->num_msgs;
                send_data->procs[send_data->num_msgs++] = local_proc;
            }
            orig_to_node[i] = node;
            send_sizes[local_proc] += size;
        }
        else
        {
            orig_to_node[i] = -1;
            local_data->procs[local_data->num_msgs] = get_local_proc(global_proc, topo_info);
            local_data->size_msgs += size;
            local_data->num_msgs++;
            local_data->indptr[local_data->num_msgs] = local_data->size_msgs;
        }
    }
    if (local_data->size_msgs)
        local_data->indices = new int[local_data->size_msgs];

    for (int i = 0; i < send_data->num_msgs; i++)
    {
        local_proc = send_data->procs[i];
        send_data->indptr[i+1] = send_data->indptr[i] + send_sizes[local_proc];
        send_sizes[local_proc] = 0;
    }
    send_data->size_msgs = send_data->indptr[send_data->num_msgs];

    // Allocate send_indices and fill vector
    if (send_data->size_msgs)
        send_data->indices = new int[send_data->size_msgs];
    std::vector<int> send_idx_node(send_data->size_msgs);
    local_data->size_msgs = 0;
    for (int i = 0; i < orig_num_sends; i++)
    {
        node = orig_to_node[i];
        start = orig_send_ptr[i];
        end = orig_send_ptr[i+1];
        if (node == -1)
        {
            for (int j = start; j < end; j++)
            {
                local_data->indices[local_data->size_msgs++] = orig_send_indices[j];
            }
        }
        else
        {
            local_proc = nodes_to_local[node];
            proc_idx = local_idx[local_proc];
            for (int j = start; j < end; j++)
            {
                idx = send_data->indptr[proc_idx] + send_sizes[local_proc]++;
                send_data->indices[idx] = orig_send_indices[j];
                send_idx_node[idx] = node;
            }
        }
    }

    // Send 'local_S_comm send' info (to form local_S recv)
    MPI_Allreduce(MPI_IN_PLACE, send_sizes.data(), local_num_procs,
            MPI_INT, MPI_SUM, local_comm);
    recv_data->size_msgs = send_sizes[local_rank];
    if (recv_data->size_msgs)
        recv_data->indices = new int[recv_data->size_msgs];
    recv_idx_nodes.resize(recv_data->size_msgs);

    send_buffer.resize(2*send_data->size_msgs);
    send_requests.resize(send_data->num_msgs);
    ctr = 0;
    start_ctr = 0;
    for (int i = 0; i < send_data->num_msgs; i++)
    {
        proc = send_data->procs[i];
        start = send_data->indptr[i];
        end = send_data->indptr[i+1];
        for (int j = start; j < end; j++)
        {
            send_buffer[ctr++] = send_data->indices[j];
            send_buffer[ctr++] = send_idx_node[j];
        }
        MPI_Isend(&send_buffer[start_ctr], ctr - start_ctr ,
                MPI_INT, proc, tag, local_comm, &send_requests[i]);
        start_ctr = ctr;
    }

    ctr = 0;
    while (ctr < recv_data->size_msgs)
    {
        MPI_Probe(MPI_ANY_SOURCE, tag, local_comm, &recv_status);
        proc = recv_status.MPI_SOURCE;
        MPI_Get_count(&recv_status, MPI_INT, &size);
        if (size > recv_buffer.size())
            recv_buffer.resize(size);
        MPI_Recv(recv_buffer.data(), size, MPI_INT, proc, tag, local_comm, &recv_status);
        for (int i = 0; i < size; i += 2)
        {
            recv_data->indices[ctr] = recv_buffer[i];
            recv_idx_nodes[ctr++] = recv_buffer[i+1];
        }
        recv_data->procs[recv_data->num_msgs] = proc;
        recv_data->indptr[recv_data->num_msgs + 1] = recv_data->indptr[recv_data->num_msgs] + (size / 2);
        recv_data->num_msgs++;
    }

    if (send_data->num_msgs)
    {
        MPI_Waitall(send_data->num_msgs, send_requests.data(), MPI_STATUSES_IGNORE);
    }
}